

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-ascii-cursor.c
# Opt level: O0

long coda_ascii_parse_uint64
               (char *buffer,long buffer_length,uint64_t *dst,int ignore_trailing_bytes)

{
  bool bVar1;
  int64_t digit;
  uint64_t value;
  long lStack_38;
  int integer_length;
  long length;
  int ignore_trailing_bytes_local;
  uint64_t *dst_local;
  long buffer_length_local;
  char *buffer_local;
  
  lStack_38 = buffer_length;
  buffer_length_local = (long)buffer;
  while( true ) {
    bVar1 = false;
    if ((0 < lStack_38) && (bVar1 = true, *(char *)buffer_length_local != ' ')) {
      bVar1 = *(char *)buffer_length_local == '\t';
    }
    if (!bVar1) break;
    buffer_length_local = buffer_length_local + 1;
    lStack_38 = lStack_38 + -1;
  }
  if (*(char *)buffer_length_local == '+') {
    buffer_length_local = buffer_length_local + 1;
    lStack_38 = lStack_38 + -1;
  }
  digit = 0;
  value._4_4_ = 0;
  for (; ((0 < lStack_38 && ('/' < *(char *)buffer_length_local)) &&
         (*(char *)buffer_length_local < ':')); buffer_length_local = buffer_length_local + 1) {
    if ((-(long)(*(char *)buffer_length_local + -0x30) - 1U) / 10 < (ulong)digit) {
      coda_set_error(-0x67,"value too large for ascii integer");
      return -1;
    }
    digit = digit * 10 + (long)(*(char *)buffer_length_local + -0x30);
    value._4_4_ = value._4_4_ + 1;
    lStack_38 = lStack_38 + -1;
  }
  if (value._4_4_ == 0) {
    coda_set_error(-0x67,"invalid format for ascii integer (no digits)");
    buffer_local = (char *)0xffffffffffffffff;
  }
  else {
    if ((ignore_trailing_bytes == 0) && (lStack_38 != 0)) {
      while( true ) {
        bVar1 = false;
        if ((0 < lStack_38) && (bVar1 = true, *(char *)buffer_length_local != ' ')) {
          bVar1 = *(char *)buffer_length_local == '\t';
        }
        if (!bVar1) break;
        buffer_length_local = buffer_length_local + 1;
        lStack_38 = lStack_38 + -1;
      }
      if (lStack_38 != 0) {
        coda_set_error(-0x67,"invalid format for ascii integer");
        return -1;
      }
    }
    *dst = digit;
    buffer_local = (char *)(buffer_length - lStack_38);
  }
  return (long)buffer_local;
}

Assistant:

long coda_ascii_parse_uint64(const char *buffer, long buffer_length, uint64_t *dst, int ignore_trailing_bytes)
{
    long length;
    int integer_length;
    uint64_t value;

    length = buffer_length;

    while (length > 0 && (*buffer == ' ' || *buffer == '\t'))
    {
        buffer++;
        length--;
    }

    if (*buffer == '+')
    {
        buffer++;
        length--;
    }

    value = 0;
    integer_length = 0;
    while (length > 0)
    {
        int64_t digit;

        if (*buffer < '0' || *buffer > '9')
        {
            break;
        }
        digit = *buffer - '0';
        if (value > (MAXUINT64 - digit) / 10)
        {
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "value too large for ascii integer");
            return -1;
        }
        value = 10 * value + digit;
        integer_length++;
        buffer++;
        length--;
    }
    if (integer_length == 0)
    {
        coda_set_error(CODA_ERROR_INVALID_FORMAT, "invalid format for ascii integer (no digits)");
        return -1;
    }
    if (!ignore_trailing_bytes && length != 0)
    {
        while (length > 0 && (*buffer == ' ' || *buffer == '\t'))
        {
            buffer++;
            length--;
        }
        if (length != 0)
        {
            coda_set_error(CODA_ERROR_INVALID_FORMAT, "invalid format for ascii integer");
            return -1;
        }
    }

    *dst = value;

    return buffer_length - length;
}